

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# take_any_args.hpp
# Opt level: O0

Elements * __thiscall
ftxui::unpack<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
          (Elements *__return_storage_ptr__,ftxui *this,shared_ptr<ftxui::Node> *args,
          shared_ptr<ftxui::Node> *args_1)

{
  shared_ptr<ftxui::Node> local_58 [2];
  shared_ptr<ftxui::Node> local_38;
  undefined1 local_21;
  shared_ptr<ftxui::Node> *local_20;
  shared_ptr<ftxui::Node> *args_local_1;
  shared_ptr<ftxui::Node> *args_local;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *vec;
  
  local_21 = 0;
  local_20 = args;
  args_local_1 = (shared_ptr<ftxui::Node> *)this;
  args_local = (shared_ptr<ftxui::Node> *)__return_storage_ptr__;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (__return_storage_ptr__);
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_38,(shared_ptr<ftxui::Node> *)this);
  Merge<std::shared_ptr<ftxui::Node>>(__return_storage_ptr__,&local_38);
  std::shared_ptr<ftxui::Node>::shared_ptr(local_58,args);
  Merge<std::shared_ptr<ftxui::Node>>(__return_storage_ptr__,local_58);
  std::shared_ptr<ftxui::Node>::~shared_ptr(local_58);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Elements unpack(Args... args) {
  std::vector<Element> vec;
  (Merge(vec, std::move(args)), ...);
  return vec;
}